

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_bfba::ktxTexture1TestBase::compareTexture
          (ktxTexture1TestBase *this,ktxTexture1 *texture)

{
  wthTexInfo *pwVar1;
  ktx_uint32_t kVar2;
  
  pwVar1 = (this->super_ktxTextureTestBase<unsigned_char,_4U,_32856U>).texinfo;
  if ((((texture->glInternalformat == (pwVar1->super_ktxTextureCreateInfo).glInternalformat) &&
       (texture->glBaseInternalformat == pwVar1->glBaseInternalformat)) &&
      (texture->glFormat == pwVar1->glFormat)) && (texture->glType == pwVar1->glType)) {
    kVar2 = ktxTexture1_glTypeSize(texture);
    pwVar1 = (this->super_ktxTextureTestBase<unsigned_char,_4U,_32856U>).texinfo;
    if ((kVar2 == pwVar1->glTypeSize) &&
       (texture->baseWidth == (pwVar1->super_ktxTextureCreateInfo).baseWidth)) {
      kVar2 = (pwVar1->super_ktxTextureCreateInfo).baseHeight;
      if (kVar2 == 0) {
        if (texture->baseHeight != 1) {
          return false;
        }
      }
      else if (texture->baseHeight != kVar2) {
        return false;
      }
      kVar2 = (pwVar1->super_ktxTextureCreateInfo).baseDepth;
      if (kVar2 == 0) {
        if (texture->baseDepth != 1) {
          return false;
        }
      }
      else if (texture->baseDepth != kVar2) {
        return false;
      }
      if (texture->numFaces == (pwVar1->super_ktxTextureCreateInfo).numFaces) {
        return texture->numLevels == (pwVar1->super_ktxTextureCreateInfo).numLevels;
      }
    }
  }
  return false;
}

Assistant:

bool
    compareTexture(ktxTexture1* texture)
    {
        if (texture->glInternalformat != texinfo.glInternalformat)
            return false;
        if (texture->glBaseInternalformat != texinfo.glBaseInternalformat)
            return false;
        if (texture->glFormat != texinfo.glFormat)
            return false;
        if (texture->glType != texinfo.glType)
            return false;
        if (ktxTexture1_glTypeSize(texture) != texinfo.glTypeSize)
            return false;
        if (texture->baseWidth != texinfo.baseWidth)
            return false;
        if (texinfo.baseHeight == 0) {
            if (texture->baseHeight != 1)
                return false;
        } else if (texture->baseHeight != texinfo.baseHeight)
            return false;
        if (texinfo.baseDepth == 0) {
            if (texture->baseDepth != 1)
                return false;
        } else if (texture->baseDepth != texinfo.baseDepth)
            return false;
        if (texture->numFaces != texinfo.numFaces)
            return false;
        if (texture->numLevels != texinfo.numLevels)
            return false;
        return true;
    }